

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ItemAdd(ImRect *bb,ImGuiID *id)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *window_00;
  ImGuiID local_34;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImGuiID *id_local;
  ImRect *bb_local;
  
  window_00 = GetCurrentWindow();
  if (id == (ImGuiID *)0x0) {
    local_34 = 0;
  }
  else {
    local_34 = *id;
  }
  (window_00->DC).LastItemId = local_34;
  (window_00->DC).LastItemRect.Min = bb->Min;
  (window_00->DC).LastItemRect.Max = bb->Max;
  (window_00->DC).LastItemHoveredRect = false;
  (window_00->DC).LastItemHoveredAndUsable = false;
  bVar2 = IsClippedEx(bb,id,false);
  pIVar1 = GImGui;
  if (bVar2) {
    bb_local._7_1_ = false;
  }
  else {
    bVar2 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if ((((bVar2) &&
         ((window_00->DC).LastItemHoveredRect = true,
         pIVar1->HoveredRootWindow == window_00->RootWindow)) &&
        (((pIVar1->ActiveId == 0 ||
          (((id != (ImGuiID *)0x0 && (pIVar1->ActiveId == *id)) ||
           ((pIVar1->ActiveIdAllowOverlap & 1U) != 0)))) || (pIVar1->ActiveId == window_00->MoveId))
        )) && (bVar2 = IsWindowContentHoverable(window_00), bVar2)) {
      (window_00->DC).LastItemHoveredAndUsable = true;
    }
    bb_local._7_1_ = true;
  }
  return bb_local._7_1_;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, const ImGuiID* id)
{
    ImGuiWindow* window = GetCurrentWindow();
    window->DC.LastItemId = id ? *id : 0;
    window->DC.LastItemRect = bb;
    window->DC.LastItemHoveredAndUsable = window->DC.LastItemHoveredRect = false;
    if (IsClippedEx(bb, id, false))
        return false;

    // This is a sensible default, but widgets are free to override it after calling ItemAdd()
    ImGuiContext& g = *GImGui;
    if (IsMouseHoveringRect(bb.Min, bb.Max))
    {
        // Matching the behavior of IsHovered() but allow if ActiveId==window->MoveID (we clicked on the window background)
        // So that clicking on items with no active id such as Text() still returns true with IsItemHovered()
        window->DC.LastItemHoveredRect = true;
        if (g.HoveredRootWindow == window->RootWindow)
            if (g.ActiveId == 0 || (id && g.ActiveId == *id) || g.ActiveIdAllowOverlap || (g.ActiveId == window->MoveId))
                if (IsWindowContentHoverable(window))
                    window->DC.LastItemHoveredAndUsable = true;
    }

    return true;
}